

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::declareStruct
          (HlslParseContext *this,TSourceLoc *loc,TString *structName,TType *type)

{
  long *plVar1;
  ulong uVar2;
  _Base_ptr p_Var3;
  _func_int *UNRECOVERED_JUMPTABLE;
  TTypeList *pTVar4;
  iterator iVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  TPoolAllocator *pTVar9;
  TVariable *this_00;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_01;
  TQualifier *pTVar10;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_02;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_03;
  _func_int **pp_Var11;
  undefined4 extraout_var_00;
  anon_union_8_2_8ac53c11_for_TType_13 aVar12;
  TType *pTVar13;
  long lVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  _Rb_tree_header *p_Var17;
  long *plVar18;
  _Rb_tree_header *p_Var19;
  HlslParseContext *pHVar20;
  TTypeLoc newUniformMember;
  TTypeLoc newOutputMember;
  TTypeLoc newInputMember;
  anon_union_8_2_8ac53c11_for_TType_13 local_98;
  TString *pTStack_90;
  long lStack_88;
  long lStack_80;
  TTypeLoc local_78;
  TTypeLoc local_58;
  _Rb_tree_header *local_38;
  
  iVar8 = (*type->_vptr_TType[7])(type);
  if ((iVar8 == 0x10) || (structName->_M_string_length == 0)) {
    return;
  }
  pTVar9 = GetThreadPoolAllocator();
  this_00 = (TVariable *)TPoolAllocator::allocate(pTVar9,0xf8);
  TVariable::TVariable(this_00,structName,structName,type,true);
  bVar6 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
  if (!bVar6) {
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)
              (this,loc,"redefinition",(structName->_M_dataplus)._M_p,"struct",UNRECOVERED_JUMPTABLE
              );
    return;
  }
  iVar8 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar8 != '\0') {
    plVar18 = *(long **)&((type->field_13).referentType)->field_0x8;
    iVar8 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar8 != '\0') {
      p_Var17 = &(this->ioTypeMap).
                 super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      this_02 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0;
      this_03 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0;
      this_01 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0;
      do {
        if (plVar18 == (long *)(((type->field_13).referentType)->qualifier).semanticName) {
          iVar8 = (*type->_vptr_TType[0x25])(type);
          if (((this_01 ==
                (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) &&
              (this_02 ==
               (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) &&
             (this_03 == (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0
             )) {
            if ((char)iVar8 != '\0') {
              pp_Var11 = type->_vptr_TType;
              plVar18 = *(long **)&((type->field_13).referentType)->field_0x8;
              while (iVar8 = (*pp_Var11[0x25])(type), (char)iVar8 != '\0') {
                if (plVar18 == (long *)(((type->field_13).referentType)->qualifier).semanticName) {
                  return;
                }
                pHVar20 = (HlslParseContext *)*plVar18;
                iVar8 = (*(pHVar20->super_TParseContextBase).super_TParseVersions.
                          _vptr_TParseVersions[10])();
                clearUniformInputOutput(pHVar20,(TQualifier *)CONCAT44(extraout_var_00,iVar8));
                plVar18 = plVar18 + 4;
                pp_Var11 = type->_vptr_TType;
              }
            }
          }
          else if ((char)iVar8 != '\0') {
            plVar18 = *(long **)&((type->field_13).referentType)->field_0x8;
            iVar8 = (*type->_vptr_TType[0x25])(type);
            if ((char)iVar8 != '\0') {
              local_38 = &(this->ioTypeMap).
                          super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                          ._M_t._M_impl.super__Rb_tree_header;
              goto LAB_0041e1ac;
            }
          }
          break;
        }
        pHVar20 = (HlslParseContext *)*plVar18;
        iVar8 = (*(pHVar20->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])
                          ();
        bVar6 = hasUniform(pHVar20,(TQualifier *)CONCAT44(extraout_var,iVar8));
        if ((bVar6) &&
           (this_01 == (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0))
        {
          pTVar9 = GetThreadPoolAllocator();
          this_01 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                    TPoolAllocator::allocate(pTVar9,0x20);
          *(undefined8 *)this_01 = 0;
          *(undefined8 *)(this_01 + 8) = 0;
          *(undefined8 *)(this_01 + 0x10) = 0;
          *(undefined8 *)(this_01 + 0x18) = 0;
          pTVar9 = GetThreadPoolAllocator();
          *(TPoolAllocator **)this_01 = pTVar9;
          *(undefined8 *)(this_01 + 8) = 0;
          *(undefined8 *)(this_01 + 0x10) = 0;
          *(undefined8 *)(this_01 + 0x18) = 0;
        }
        pTVar10 = (TQualifier *)(**(code **)(*(long *)*plVar18 + 0x50))();
        bVar6 = hasInput(this,pTVar10);
        if ((bVar6) &&
           (this_02 == (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0))
        {
          pTVar9 = GetThreadPoolAllocator();
          this_02 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                    TPoolAllocator::allocate(pTVar9,0x20);
          *(undefined8 *)this_02 = 0;
          *(undefined8 *)(this_02 + 8) = 0;
          *(undefined8 *)(this_02 + 0x10) = 0;
          *(undefined8 *)(this_02 + 0x18) = 0;
          pTVar9 = GetThreadPoolAllocator();
          *(TPoolAllocator **)this_02 = pTVar9;
          *(undefined8 *)(this_02 + 8) = 0;
          *(undefined8 *)(this_02 + 0x10) = 0;
          *(undefined8 *)(this_02 + 0x18) = 0;
        }
        pTVar10 = (TQualifier *)(**(code **)(*(long *)*plVar18 + 0x50))();
        bVar6 = hasOutput(this,pTVar10);
        if ((bVar6) &&
           (this_03 == (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0))
        {
          pTVar9 = GetThreadPoolAllocator();
          this_03 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                    TPoolAllocator::allocate(pTVar9,0x20);
          *(undefined8 *)this_03 = 0;
          *(undefined8 *)(this_03 + 8) = 0;
          *(undefined8 *)(this_03 + 0x10) = 0;
          *(undefined8 *)(this_03 + 0x18) = 0;
          pTVar9 = GetThreadPoolAllocator();
          *(TPoolAllocator **)this_03 = pTVar9;
          *(undefined8 *)(this_03 + 8) = 0;
          *(undefined8 *)(this_03 + 0x10) = 0;
          *(undefined8 *)(this_03 + 0x18) = 0;
        }
        cVar7 = (**(code **)(*(long *)*plVar18 + 0x128))();
        if (cVar7 != '\0') {
          plVar1 = (long *)*plVar18;
          cVar7 = (**(code **)(*plVar1 + 0x128))(plVar1);
          if (cVar7 == '\0') break;
          uVar2 = plVar1[0xd];
          p_Var3 = (this->ioTypeMap).
                   super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var16 = &p_Var17->_M_header;
          for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
              p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < uVar2]) {
            if (*(ulong *)(p_Var3 + 1) >= uVar2) {
              p_Var16 = p_Var3;
            }
          }
          p_Var19 = p_Var17;
          if (((_Rb_tree_header *)p_Var16 != p_Var17) &&
             (p_Var19 = (_Rb_tree_header *)p_Var16,
             uVar2 < ((_Rb_tree_header *)p_Var16)->_M_node_count)) {
            p_Var19 = p_Var17;
          }
          if (p_Var19 != p_Var17) {
            if ((*(long *)((long)(p_Var19 + 1) + 0x10) != 0) &&
               (this_01 ==
                (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) {
              pTVar9 = GetThreadPoolAllocator();
              this_01 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                        TPoolAllocator::allocate(pTVar9,0x20);
              *(undefined8 *)this_01 = 0;
              *(undefined8 *)(this_01 + 8) = 0;
              *(undefined8 *)(this_01 + 0x10) = 0;
              *(undefined8 *)(this_01 + 0x18) = 0;
              pTVar9 = GetThreadPoolAllocator();
              *(TPoolAllocator **)this_01 = pTVar9;
              *(undefined8 *)(this_01 + 8) = 0;
              *(undefined8 *)(this_01 + 0x10) = 0;
              *(undefined8 *)(this_01 + 0x18) = 0;
            }
            if ((*(long *)(p_Var19 + 1) != 0) &&
               (this_02 ==
                (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) {
              pTVar9 = GetThreadPoolAllocator();
              this_02 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                        TPoolAllocator::allocate(pTVar9,0x20);
              *(undefined8 *)this_02 = 0;
              *(undefined8 *)(this_02 + 8) = 0;
              *(undefined8 *)(this_02 + 0x10) = 0;
              *(undefined8 *)(this_02 + 0x18) = 0;
              pTVar9 = GetThreadPoolAllocator();
              *(TPoolAllocator **)this_02 = pTVar9;
              *(undefined8 *)(this_02 + 8) = 0;
              *(undefined8 *)(this_02 + 0x10) = 0;
              *(undefined8 *)(this_02 + 0x18) = 0;
            }
            if ((*(long *)((long)(p_Var19 + 1) + 8) != 0) &&
               (this_03 ==
                (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) {
              pTVar9 = GetThreadPoolAllocator();
              this_03 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                        TPoolAllocator::allocate(pTVar9,0x20);
              *(undefined8 *)this_03 = 0;
              *(undefined8 *)(this_03 + 8) = 0;
              *(undefined8 *)(this_03 + 0x10) = 0;
              *(undefined8 *)(this_03 + 0x18) = 0;
              pTVar9 = GetThreadPoolAllocator();
              *(TPoolAllocator **)this_03 = pTVar9;
              *(undefined8 *)(this_03 + 8) = 0;
              *(undefined8 *)(this_03 + 0x10) = 0;
              *(undefined8 *)(this_03 + 0x18) = 0;
            }
          }
        }
        plVar18 = plVar18 + 4;
        iVar8 = (*type->_vptr_TType[0x25])(type);
      } while ((char)iVar8 != '\0');
    }
  }
  goto LAB_0041e664;
LAB_0041e1ac:
  do {
    if (plVar18 == (long *)(((type->field_13).referentType)->qualifier).semanticName) {
      iVar8 = (*type->_vptr_TType[0x25])(type);
      if ((char)iVar8 != '\0') {
        local_98 = type->field_13;
        pmVar15 = std::
                  map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                  ::operator[](&(this->ioTypeMap).
                                super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                               ,&local_98.structure);
        pmVar15->input = (TTypeList *)this_02;
        pmVar15->output = (TTypeList *)this_03;
        pmVar15->uniform = (TTypeList *)this_01;
        return;
      }
      break;
    }
    local_98.structure = (TTypeList *)0x0;
    lStack_80 = plVar18[3];
    pTStack_90 = (TString *)plVar18[1];
    lStack_88 = plVar18[2];
    local_58.type = (TType *)0x0;
    local_58.loc._16_8_ = plVar18[3];
    local_58.loc.name = (TString *)plVar18[1];
    local_58.loc._8_8_ = plVar18[2];
    local_78.type = (TType *)0x0;
    local_78.loc._16_8_ = plVar18[3];
    local_78.loc.name._0_4_ = (undefined4)plVar18[1];
    local_78.loc.name._4_4_ = *(undefined4 *)((long)plVar18 + 0xc);
    local_78.loc.string = (int)plVar18[2];
    local_78.loc.line = *(int *)((long)plVar18 + 0x14);
    cVar7 = (**(code **)(*(long *)*plVar18 + 0x128))();
    if (cVar7 != '\0') {
      plVar1 = (long *)*plVar18;
      cVar7 = (**(code **)(*plVar1 + 0x128))(plVar1);
      if (cVar7 == '\0') break;
      uVar2 = plVar1[0xd];
      p_Var17 = local_38;
      for (p_Var3 = (this->ioTypeMap).
                    super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < uVar2]) {
        if (*(ulong *)(p_Var3 + 1) >= uVar2) {
          p_Var17 = (_Rb_tree_header *)p_Var3;
        }
      }
      p_Var19 = local_38;
      if ((p_Var17 != local_38) && (p_Var19 = p_Var17, uVar2 < p_Var17->_M_node_count)) {
        p_Var19 = local_38;
      }
      if (p_Var19 != local_38) {
        pTVar4 = *(TTypeList **)((long)(p_Var19 + 1) + 0x10);
        if (pTVar4 != (TTypeList *)0x0) {
          pTVar9 = GetThreadPoolAllocator();
          aVar12.structure = (TTypeList *)TPoolAllocator::allocate(pTVar9,0x98);
          TType::TType(aVar12.referentType,EbtVoid,EvqTemporary,1,0,0,false);
          local_98.structure = aVar12.structure;
          TType::shallowCopy(aVar12.referentType,(TType *)*plVar18);
          aVar12 = local_98;
          iVar8 = (*(((TParseContextBase *)&(local_98.referentType)->_vptr_TType)->
                    super_TParseVersions)._vptr_TParseVersions[0x25])(local_98.structure);
          if ((char)iVar8 == '\0') goto LAB_0041e6cc;
          ((anon_union_8_2_8ac53c11_for_TType_13 *)((long)(aVar12.structure + 3) + 8))->structure =
               pTVar4;
        }
        pTVar4 = *(TTypeList **)(p_Var19 + 1);
        if (pTVar4 != (TTypeList *)0x0) {
          pTVar9 = GetThreadPoolAllocator();
          pTVar13 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
          TType::TType(pTVar13,EbtVoid,EvqTemporary,1,0,0,false);
          local_58.type = pTVar13;
          TType::shallowCopy(pTVar13,(TType *)*plVar18);
          pTVar13 = local_58.type;
          iVar8 = (*(local_58.type)->_vptr_TType[0x25])(local_58.type);
          if ((char)iVar8 == '\0') goto LAB_0041e6cc;
          (pTVar13->field_13).structure = pTVar4;
        }
        pTVar4 = *(TTypeList **)((long)(p_Var19 + 1) + 8);
        if (pTVar4 != (TTypeList *)0x0) {
          pTVar9 = GetThreadPoolAllocator();
          pTVar13 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
          TType::TType(pTVar13,EbtVoid,EvqTemporary,1,0,0,false);
          local_78.type = pTVar13;
          TType::shallowCopy(pTVar13,(TType *)*plVar18);
          pTVar13 = local_78.type;
          iVar8 = (*(local_78.type)->_vptr_TType[0x25])(local_78.type);
          if ((char)iVar8 == '\0') {
LAB_0041e6cc:
            __assert_fail("isStruct()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                          ,0x9e0,"void glslang::TType::setStruct(TTypeList *)");
          }
          (pTVar13->field_13).structure = pTVar4;
        }
      }
    }
    if (this_01 != (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) {
      if ((HlslParseContext *)local_98.structure == (HlslParseContext *)0x0) {
        pTVar9 = GetThreadPoolAllocator();
        aVar12.structure = (TTypeList *)TPoolAllocator::allocate(pTVar9,0x98);
        TType::TType(aVar12.referentType,EbtVoid,EvqTemporary,1,0,0,false);
        local_98.structure = aVar12.structure;
        TType::shallowCopy(aVar12.referentType,(TType *)*plVar18);
      }
      cVar7 = (**(code **)(*(long *)*plVar18 + 0xe0))();
      if ((cVar7 != '\0') &&
         (lVar14 = (**(code **)(*(long *)*plVar18 + 0x50))(),
         *(ulong *)(lVar14 + 8) < 0x2000000000000000)) {
        uVar2 = *(ulong *)&(this->globalUniformDefaults).field_0x8;
        iVar8 = (*(((TParseContextBase *)&(local_98.referentType)->_vptr_TType)->
                  super_TParseVersions)._vptr_TParseVersions[10])();
        *(ulong *)(CONCAT44(extraout_var_01,iVar8) + 8) =
             *(ulong *)(CONCAT44(extraout_var_01,iVar8) + 8) & 0x1fffffffffffffff |
             uVar2 & 0xe000000000000000;
      }
      aVar12 = local_98;
      iVar8 = (*(((TParseContextBase *)&(local_98.referentType)->_vptr_TType)->super_TParseVersions)
                ._vptr_TParseVersions[10])();
      correctUniform((HlslParseContext *)aVar12.structure,
                     (TQualifier *)CONCAT44(extraout_var_02,iVar8));
      iVar5._M_current = *(TTypeLoc **)(this_01 + 0x10);
      if (iVar5._M_current == *(TTypeLoc **)(this_01 + 0x18)) {
        std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
        _M_realloc_insert<glslang::TTypeLoc_const&>(this_01,iVar5,(TTypeLoc *)&local_98);
      }
      else {
        ((iVar5._M_current)->loc).string = (undefined4)lStack_88;
        ((iVar5._M_current)->loc).line = lStack_88._4_4_;
        *(long *)&((iVar5._M_current)->loc).column = lStack_80;
        (iVar5._M_current)->type = (TType *)local_98;
        ((iVar5._M_current)->loc).name = pTStack_90;
        *(long *)(this_01 + 0x10) = *(long *)(this_01 + 0x10) + 0x20;
      }
    }
    if (this_02 != (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) {
      if (local_58.type == (TType *)0x0) {
        pTVar9 = GetThreadPoolAllocator();
        pTVar13 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
        TType::TType(pTVar13,EbtVoid,EvqTemporary,1,0,0,false);
        local_58.type = pTVar13;
        TType::shallowCopy(pTVar13,(TType *)*plVar18);
      }
      iVar8 = (*(local_58.type)->_vptr_TType[10])();
      correctInput(this,(TQualifier *)CONCAT44(extraout_var_03,iVar8));
      iVar5._M_current = *(TTypeLoc **)(this_02 + 0x10);
      if (iVar5._M_current == *(TTypeLoc **)(this_02 + 0x18)) {
        std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
        _M_realloc_insert<glslang::TTypeLoc_const&>(this_02,iVar5,&local_58);
      }
      else {
        ((iVar5._M_current)->loc).string = local_58.loc.string;
        ((iVar5._M_current)->loc).line = local_58.loc.line;
        ((iVar5._M_current)->loc).column = local_58.loc.column;
        *(undefined4 *)&((iVar5._M_current)->loc).field_0x14 = local_58.loc._20_4_;
        (iVar5._M_current)->type = local_58.type;
        ((iVar5._M_current)->loc).name = local_58.loc.name;
        *(long *)(this_02 + 0x10) = *(long *)(this_02 + 0x10) + 0x20;
      }
    }
    if (this_03 != (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) {
      if (local_78.type == (TType *)0x0) {
        pTVar9 = GetThreadPoolAllocator();
        pTVar13 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
        TType::TType(pTVar13,EbtVoid,EvqTemporary,1,0,0,false);
        local_78.type = pTVar13;
        TType::shallowCopy(pTVar13,(TType *)*plVar18);
      }
      iVar8 = (*(local_78.type)->_vptr_TType[10])();
      correctOutput(this,(TQualifier *)CONCAT44(extraout_var_04,iVar8));
      iVar5._M_current = *(TTypeLoc **)(this_03 + 0x10);
      if (iVar5._M_current == *(TTypeLoc **)(this_03 + 0x18)) {
        std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
        _M_realloc_insert<glslang::TTypeLoc_const&>(this_03,iVar5,&local_78);
      }
      else {
        ((iVar5._M_current)->loc).string = local_78.loc.string;
        ((iVar5._M_current)->loc).line = local_78.loc.line;
        ((iVar5._M_current)->loc).column = local_78.loc.column;
        *(undefined4 *)&((iVar5._M_current)->loc).field_0x14 = local_78.loc._20_4_;
        (iVar5._M_current)->type = local_78.type;
        ((iVar5._M_current)->loc).name =
             (TString *)CONCAT44(local_78.loc.name._4_4_,local_78.loc.name._0_4_);
        *(long *)(this_03 + 0x10) = *(long *)(this_03 + 0x10) + 0x20;
      }
    }
    pHVar20 = (HlslParseContext *)*plVar18;
    iVar8 = (*(pHVar20->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])();
    clearUniformInputOutput(pHVar20,(TQualifier *)CONCAT44(extraout_var_05,iVar8));
    plVar18 = plVar18 + 4;
    iVar8 = (*type->_vptr_TType[0x25])(type);
  } while ((char)iVar8 != '\0');
LAB_0041e664:
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

void HlslParseContext::declareStruct(const TSourceLoc& loc, TString& structName, TType& type)
{
    // If it was named, which means the type can be reused later, add
    // it to the symbol table.  (Unless it's a block, in which
    // case the name is not a type.)
    if (type.getBasicType() == EbtBlock || structName.size() == 0)
        return;

    TVariable* userTypeDef = new TVariable(&structName, type, true);
    if (! symbolTable.insert(*userTypeDef)) {
        error(loc, "redefinition", structName.c_str(), "struct");
        return;
    }

    // See if we need IO aliases for the structure typeList

    const auto condAlloc = [](bool pred, TTypeList*& list) {
        if (pred && list == nullptr)
            list = new TTypeList;
    };

    tIoKinds newLists = { nullptr, nullptr, nullptr }; // allocate for each kind found
    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
        condAlloc(hasUniform(member->type->getQualifier()), newLists.uniform);
        condAlloc(  hasInput(member->type->getQualifier()), newLists.input);
        condAlloc( hasOutput(member->type->getQualifier()), newLists.output);

        if (member->type->isStruct()) {
            auto it = ioTypeMap.find(member->type->getStruct());
            if (it != ioTypeMap.end()) {
                condAlloc(it->second.uniform != nullptr, newLists.uniform);
                condAlloc(it->second.input   != nullptr, newLists.input);
                condAlloc(it->second.output  != nullptr, newLists.output);
            }
        }
    }
    if (newLists.uniform == nullptr &&
        newLists.input   == nullptr &&
        newLists.output  == nullptr) {
        // Won't do any IO caching, clear up the type and get out now.
        for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member)
            clearUniformInputOutput(member->type->getQualifier());
        return;
    }

    // We have IO involved.

    // Make a pure typeList for the symbol table, and cache side copies of IO versions.
    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
        const auto inheritStruct = [&](TTypeList* s, TTypeLoc& ioMember) {
            if (s != nullptr) {
                ioMember.type = new TType;
                ioMember.type->shallowCopy(*member->type);
                ioMember.type->setStruct(s);
            }
        };
        const auto newMember = [&](TTypeLoc& m) {
            if (m.type == nullptr) {
                m.type = new TType;
                m.type->shallowCopy(*member->type);
            }
        };

        TTypeLoc newUniformMember = { nullptr, member->loc };
        TTypeLoc newInputMember   = { nullptr, member->loc };
        TTypeLoc newOutputMember  = { nullptr, member->loc };
        if (member->type->isStruct()) {
            // swap in an IO child if there is one
            auto it = ioTypeMap.find(member->type->getStruct());
            if (it != ioTypeMap.end()) {
                inheritStruct(it->second.uniform, newUniformMember);
                inheritStruct(it->second.input,   newInputMember);
                inheritStruct(it->second.output,  newOutputMember);
            }
        }
        if (newLists.uniform) {
            newMember(newUniformMember);

            // inherit default matrix layout (changeable via #pragma pack_matrix), if none given.
            if (member->type->isMatrix() && member->type->getQualifier().layoutMatrix == ElmNone)
                newUniformMember.type->getQualifier().layoutMatrix = globalUniformDefaults.layoutMatrix;

            correctUniform(newUniformMember.type->getQualifier());
            newLists.uniform->push_back(newUniformMember);
        }
        if (newLists.input) {
            newMember(newInputMember);
            correctInput(newInputMember.type->getQualifier());
            newLists.input->push_back(newInputMember);
        }
        if (newLists.output) {
            newMember(newOutputMember);
            correctOutput(newOutputMember.type->getQualifier());
            newLists.output->push_back(newOutputMember);
        }

        // make original pure
        clearUniformInputOutput(member->type->getQualifier());
    }
    ioTypeMap[type.getStruct()] = newLists;
}